

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool __thiscall
Catch::Matchers::StringEqualsMatcher::match(StringEqualsMatcher *this,string *source)

{
  __type _Var1;
  string local_38;
  string *local_18;
  string *source_local;
  StringEqualsMatcher *this_local;
  
  local_18 = source;
  source_local = (string *)this;
  CasedString::adjustString(&local_38,&(this->super_StringMatcherBase).m_comparator,source);
  _Var1 = std::operator==(&local_38,&(this->super_StringMatcherBase).m_comparator.m_str);
  std::__cxx11::string::~string((string *)&local_38);
  return _Var1;
}

Assistant:

bool StringEqualsMatcher::match(std::string const &source) const {
            return m_comparator.adjustString(source) == m_comparator.m_str;
        }